

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O1

void __thiscall
cmCustomCommandGenerator::AppendArguments(cmCustomCommandGenerator *this,uint c,string *cmd)

{
  pointer pcVar1;
  size_type sVar2;
  char *pcVar3;
  uint uVar4;
  string arg;
  string local_78;
  uint local_54;
  string local_50;
  
  pcVar3 = GetCrossCompilingEmulator(this,c);
  pcVar1 = (this->CommandLines).
           super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
           super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(pcVar3 == (char *)0x0) <
      (ulong)((long)*(pointer *)
                     ((long)&pcVar1[c].
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     + 8) -
              *(long *)&pcVar1[c].
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             >> 5)) {
    uVar4 = (uint)(pcVar3 == (char *)0x0);
    local_54 = c;
    do {
      uVar4 = uVar4 + 1;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      if (uVar4 == 1) {
        pcVar3 = GetArgv0Location(this,local_54);
      }
      else {
        pcVar3 = (char *)0x0;
      }
      sVar2 = local_50._M_string_length;
      if (pcVar3 == (char *)0x0) {
        std::__cxx11::string::_M_assign((string *)&local_50);
      }
      else {
        strlen(pcVar3);
        std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)sVar2,(ulong)pcVar3);
      }
      std::__cxx11::string::append((char *)cmd);
      if (this->OldStyle == true) {
        escapeForShellOldStyle(&local_78,&local_50);
        std::__cxx11::string::_M_append((char *)cmd,(ulong)local_78._M_dataplus._M_p);
      }
      else {
        cmOutputConverter::EscapeForShell
                  (&local_78,&this->LG->super_cmOutputConverter,&local_50,this->MakeVars,false,false
                  );
        std::__cxx11::string::_M_append((char *)cmd,(ulong)local_78._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
    } while ((ulong)uVar4 <
             (ulong)((long)*(pointer *)
                            ((long)&pcVar1[c].
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            + 8) -
                     *(long *)&pcVar1[c].
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    >> 5));
  }
  return;
}

Assistant:

void cmCustomCommandGenerator::AppendArguments(unsigned int c,
                                               std::string& cmd) const
{
  unsigned int offset = 1;
  if (this->GetCrossCompilingEmulator(c) != nullptr) {
    offset = 0;
  }
  cmCustomCommandLine const& commandLine = this->CommandLines[c];
  for (unsigned int j = offset; j < commandLine.size(); ++j) {
    std::string arg;
    if (const char* location = j == 0 ? this->GetArgv0Location(c) : nullptr) {
      // GetCommand returned the emulator instead of the argv0 location,
      // so transform the latter now.
      arg = location;
    } else {
      arg = commandLine[j];
    }
    cmd += " ";
    if (this->OldStyle) {
      cmd += escapeForShellOldStyle(arg);
    } else {
      cmd += this->LG->EscapeForShell(arg, this->MakeVars);
    }
  }
}